

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::reset(task_impl_base<_1a67ba37_> *this)

{
  element_type *node;
  shared_future<void> local_20;
  task_impl_base<_1a67ba37_> *local_10;
  task_impl_base<_1a67ba37_> *this_local;
  
  local_10 = this;
  ensure_task_not_running(this);
  std::shared_future<void>::shared_future(&local_20);
  std::shared_future<void>::operator=(&this->future_,&local_20);
  std::shared_future<void>::~shared_future(&local_20);
  node = std::__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )&this->node_);
  node_manip::set_canceled(node,false);
  this->schedule_mode_ = true;
  return;
}

Assistant:

void reset() override {
        ensure_task_not_running();
        future_ = std::shared_future<result_type>();
        transwarp::detail::node_manip::set_canceled(*node_, false);
        schedule_mode_ = true;
    }